

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::WriteUnbuffered
          (PosixWritableFile *this,char *data,size_t size)

{
  long lVar1;
  ssize_t sVar2;
  int *piVar3;
  size_t in_RCX;
  void *in_RDX;
  long in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  ssize_t write_result;
  string *context;
  size_t local_28;
  void *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  context = in_RDI;
  local_28 = in_RCX;
  local_20 = in_RDX;
  do {
    while( true ) {
      if (local_28 == 0) {
        Status::OK();
        goto LAB_018d10e4;
      }
      sVar2 = ::write(*(int *)(in_RSI + 0x10010),local_20,local_28);
      if (sVar2 < 0) break;
      local_20 = (void *)(sVar2 + (long)local_20);
      local_28 = local_28 - sVar2;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  __errno_location();
  PosixError(context,(int)((ulong)in_RDI >> 0x20));
LAB_018d10e4:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Status)(char *)context;
}

Assistant:

Status WriteUnbuffered(const char* data, size_t size) {
    while (size > 0) {
      ssize_t write_result = ::write(fd_, data, size);
      if (write_result < 0) {
        if (errno == EINTR) {
          continue;  // Retry
        }
        return PosixError(filename_, errno);
      }
      data += write_result;
      size -= write_result;
    }
    return Status::OK();
  }